

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_protect(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  CHAR_DATA *pCVar2;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var3;
  CHAR_DATA *victim;
  char *in_stack_000023e0;
  CHAR_DATA *in_stack_000023e8;
  int in_stack_00002510;
  int in_stack_00002514;
  void *in_stack_00002518;
  void *in_stack_00002520;
  CHAR_DATA *in_stack_00002528;
  char *in_stack_00002530;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  if (*in_RSI == '\0') {
    uVar1 = *(ulong *)(*(long *)(in_RDI + 0xa8) + 0x140);
    _Var3 = std::pow<int,int>(0,0x592c86);
    if ((uVar1 & (long)_Var3) == 0) {
      _Var3 = std::pow<int,int>(0,0x592ce6);
      *(ulong *)(*(long *)(in_RDI + 0xa8) + 0x140) =
           (long)_Var3 | *(ulong *)(*(long *)(in_RDI + 0xa8) + 0x140);
    }
    else {
      _Var3 = std::pow<int,int>(0,0x592ca8);
      *(ulong *)(*(long *)(in_RDI + 0xa8) + 0x140) =
           ((long)_Var3 ^ 0xffffffffffffffffU) & *(ulong *)(*(long *)(in_RDI + 0xa8) + 0x140);
    }
    send_to_char(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    pCVar2 = get_char_world(in_stack_000023e8,in_stack_000023e0);
    if (pCVar2 == (CHAR_DATA *)0x0) {
      send_to_char(in_RSI,(CHAR_DATA *)0x0);
    }
    else {
      uVar1 = pCVar2->comm[0];
      _Var3 = std::pow<int,int>(0,0x592d76);
      if ((uVar1 & (long)_Var3) == 0) {
        act_new(in_stack_00002530,in_stack_00002528,in_stack_00002520,in_stack_00002518,
                in_stack_00002514,in_stack_00002510);
        _Var3 = std::pow<int,int>(0,0x592e0a);
        pCVar2->comm[0] = (long)_Var3 | pCVar2->comm[0];
      }
      else {
        act_new(in_stack_00002530,in_stack_00002528,in_stack_00002520,in_stack_00002518,
                in_stack_00002514,in_stack_00002510);
        _Var3 = std::pow<int,int>(0,0x592dba);
        pCVar2->comm[0] = ((long)_Var3 ^ 0xffffffffffffffffU) & pCVar2->comm[0];
      }
    }
  }
  return;
}

Assistant:

void do_protect(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;

	if (argument[0] == '\0')
	{
		TOGGLE_BIT(ch->in_room->room_flags, ROOM_IMP_ONLY);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, argument);

	if (victim == nullptr)
	{
		send_to_char("You can't find them.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_SNOOP_PROOF))
	{
		act_new("$N is no longer snoop-proof.", ch, nullptr, victim, TO_CHAR, POS_DEAD);
		/*send_to_char("Your snoop-proofing was just removed.\n\r",victim);*/
		REMOVE_BIT(victim->comm, COMM_SNOOP_PROOF);
	}
	else
	{
		act_new("$N is now snoop-proof.", ch, nullptr, victim, TO_CHAR, POS_DEAD);
		/*send_to_char("You are now immune to snooping.\n\r",victim);*/
		SET_BIT(victim->comm, COMM_SNOOP_PROOF);
	}
}